

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# evp.c
# Opt level: O1

int INT_EVtake_event_buffer(CManager_conflict cm,void *event)

{
  _event_path_data *p_Var1;
  queue_item *pqVar2;
  int iVar3;
  event_item *peVar4;
  
  p_Var1 = cm->evp;
  for (pqVar2 = p_Var1->current_event_list; pqVar2 != (queue_item *)0x0; pqVar2 = pqVar2->next) {
    peVar4 = pqVar2->item;
    if (((peVar4->decoded_event <= event) &&
        (event <= (void *)((long)peVar4->decoded_event + peVar4->event_len))) ||
       ((peVar4->encoded_event <= event &&
        (event <= (void *)((long)peVar4->encoded_event + peVar4->event_len))))) goto LAB_00132f94;
  }
  peVar4 = (event_item *)0x0;
LAB_00132f94:
  if (peVar4 == (event_item *)0x0) {
    iVar3 = 0;
    fprintf(_stderr,
            "Event address (%p) in INT_EVtake_event_buffer does not match currently executing event on this CM.\n"
           );
  }
  else {
    pqVar2 = p_Var1->queue_items_free_list;
    if (pqVar2 == (queue_item *)0x0) {
      pqVar2 = (queue_item *)INT_CMmalloc(0x18);
    }
    else {
      p_Var1->queue_items_free_list = pqVar2->next;
    }
    pqVar2->item = peVar4;
    peVar4->ref_count = peVar4->ref_count + 1;
    pqVar2->next = p_Var1->taken_events_list;
    p_Var1->taken_events_list = pqVar2;
    iVar3 = 1;
  }
  return iVar3;
}

Assistant:

extern int
INT_EVtake_event_buffer(CManager cm, void *event)
{
    queue_item *item;
    event_item *cur = NULL;
    queue_item *running_events = cm->evp->current_event_list;
    event_path_data evp = cm->evp;

    while(running_events != NULL) {
	cur = running_events->item;
	if (!(((cur->decoded_event <= event) &&
	       ((char *) event <= ((char *) cur->decoded_event + cur->event_len))) ||
	      ((cur->encoded_event <= event) &&
	       ((char *) event <= ((char *) cur->encoded_event + cur->event_len))))) {
	    cur = NULL;
	} else {
	    break;
	}
	running_events = running_events->next;
    }
    if (cur == NULL) {
	fprintf(stderr,
		"Event address (%p) in INT_EVtake_event_buffer does not match currently executing event on this CM.\n",
		event);
	return 0;
    }

/*    if (cur->block_rec == NULL) {
	static int take_event_warning = 0;
	if (take_event_warning == 0) {
	    fprintf(stderr,
		    "Warning:  INT_EVtake_event_buffer called on an event submitted with \n    INT_EVsubmit_event(), INT_EVsubmit_typed_event() or INT_EVsubmit_eventV() .\n    This violates ECho event data memory handling requirements.  See \n    http://www.cc.gatech.edu/systems/projects/ECho/event_memory.html\n");
	    take_event_warning++;
	}
	return 0;
    }
*/
    if (evp->queue_items_free_list == NULL) {
	item = malloc(sizeof(*item));
    } else {
	item = evp->queue_items_free_list;
	evp->queue_items_free_list = item->next;
    }
    item->item = cur;
    reference_event(cur);
    item->next = evp->taken_events_list;
    evp->taken_events_list = item;
    return 1;
}